

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O0

int setup_listener(void)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_24 [8];
  sockaddr_in sin;
  int fd;
  int one;
  int rc;
  
  fd = -1;
  sin.sin_zero[4] = '\x01';
  sin.sin_zero[5] = '\0';
  sin.sin_zero[6] = '\0';
  sin.sin_zero[7] = '\0';
  sin.sin_zero._0_4_ = socket(2,1,0);
  pFVar1 = _stderr;
  if (sin.sin_zero._0_4_ == -1) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,"socket: %s\n",pcVar4);
  }
  else {
    local_24._0_2_ = 2;
    local_24._4_4_ = cfg.addr;
    local_24._2_2_ = htons((uint16_t)cfg.port);
    setsockopt(sin.sin_zero._0_4_,1,2,sin.sin_zero + 4,4);
    iVar2 = bind(sin.sin_zero._0_4_,(sockaddr *)local_24,0x10);
    pFVar1 = _stderr;
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(pFVar1,"bind: %s\n",pcVar4);
    }
    else {
      iVar2 = listen(sin.sin_zero._0_4_,1);
      pFVar1 = _stderr;
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"listen: %s\n",pcVar4);
      }
      else {
        cfg.listener_fd._0_1_ = sin.sin_zero[0];
        cfg.listener_fd._1_1_ = sin.sin_zero[1];
        cfg.listener_fd._2_1_ = sin.sin_zero[2];
        cfg.listener_fd._3_1_ = sin.sin_zero[3];
        fd = 0;
      }
    }
  }
  if ((fd < 0) && (sin.sin_zero._0_4_ != -1)) {
    close(sin.sin_zero._0_4_);
  }
  return fd;
}

Assistant:

int setup_listener() {
  int rc = -1, one=1;

  int fd = socket(AF_INET, SOCK_STREAM, 0);
  if (fd == -1) {
    fprintf(stderr,"socket: %s\n", strerror(errno));
    goto done;
  }

  /**********************************************************
   * internet socket address structure: our address and port
   *********************************************************/
  struct sockaddr_in sin;
  sin.sin_family = AF_INET;
  sin.sin_addr.s_addr = cfg.addr;
  sin.sin_port = htons(cfg.port);

  /**********************************************************
   * bind socket to address and port 
   *********************************************************/
  setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &one, sizeof(one));
  if (bind(fd, (struct sockaddr*)&sin, sizeof(sin)) == -1) {
    fprintf(stderr,"bind: %s\n", strerror(errno));
    goto done;
  }

  /**********************************************************
   * put socket into listening state
   *********************************************************/
  if (listen(fd,1) == -1) {
    fprintf(stderr,"listen: %s\n", strerror(errno));
    goto done;
  }

  cfg.listener_fd = fd;
  rc=0;

 done:
  if ((rc < 0) && (fd != -1)) close(fd);
  return rc;
}